

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM3 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  __m128 afVar28;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 local_a1;
  ulong local_a0;
  size_t local_98;
  size_t local_90;
  ulong local_88;
  Mat *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  p_Var1 = this->_vptr_BinaryOp_x86[-3];
  local_80 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar18._0_4_ = *(float *)*pauVar15 + fVar17;
        auVar18._4_4_ = *(float *)((long)*pauVar15 + 4) + fVar17;
        auVar18._8_4_ = *(float *)((long)*pauVar15 + 8) + fVar17;
        auVar18._12_4_ = *(float *)((long)*pauVar15 + 0xc) + fVar17;
        *pauVar15 = auVar18;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) =
             *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) + fVar17;
      }
    }
    break;
  case 1:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar22._0_4_ = *(float *)*pauVar15 - fVar17;
        auVar22._4_4_ = *(float *)((long)*pauVar15 + 4) - fVar17;
        auVar22._8_4_ = *(float *)((long)*pauVar15 + 8) - fVar17;
        auVar22._12_4_ = *(float *)((long)*pauVar15 + 0xc) - fVar17;
        *pauVar15 = auVar22;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) =
             *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) - fVar17;
      }
    }
    break;
  case 2:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar19._0_4_ = *(float *)*pauVar15 * fVar17;
        auVar19._4_4_ = *(float *)((long)*pauVar15 + 4) * fVar17;
        auVar19._8_4_ = *(float *)((long)*pauVar15 + 8) * fVar17;
        auVar19._12_4_ = *(float *)((long)*pauVar15 + 0xc) * fVar17;
        *pauVar15 = auVar19;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) =
             *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) * fVar17;
      }
    }
    break;
  case 3:
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    fVar17 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar20._0_4_ = *(float *)*pauVar15 * fVar17;
        auVar20._4_4_ = *(float *)((long)*pauVar15 + 4) * fVar17;
        auVar20._8_4_ = *(float *)((long)*pauVar15 + 8) * fVar17;
        auVar20._12_4_ = *(float *)((long)*pauVar15 + 0xc) * fVar17;
        *pauVar15 = auVar20;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) =
             *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) * fVar17;
      }
    }
    break;
  case 4:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar9._4_4_ = fVar17;
        auVar9._0_4_ = fVar17;
        auVar9._8_4_ = fVar17;
        auVar9._12_4_ = fVar17;
        auVar23 = maxps(*pauVar15,auVar9);
        *pauVar15 = auVar23;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        fVar24 = *(float *)((long)pvVar2 + lVar14 * 4 + lVar10);
        if (fVar24 <= fVar17) {
          fVar24 = fVar17;
        }
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) = fVar24;
      }
    }
    break;
  case 5:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar8._4_4_ = fVar17;
        auVar8._0_4_ = fVar17;
        auVar8._8_4_ = fVar17;
        auVar8._12_4_ = fVar17;
        auVar23 = minps(*pauVar15,auVar8);
        *pauVar15 = auVar23;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        fVar24 = *(float *)((long)pvVar2 + lVar14 * 4 + lVar10);
        if (fVar17 <= fVar24) {
          fVar24 = fVar17;
        }
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) = fVar24;
      }
    }
    break;
  case 6:
    local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_68 = ZEXT416((uint)local_78);
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    while (local_88 != local_a0) {
      pvVar2 = bottom_top_blob->data;
      local_98 = bottom_top_blob->elemsize;
      local_90 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(local_90 * local_88 * local_98 + (long)pvVar2);
      local_48[1] = fStack_74;
      local_48[0] = local_78;
      afStack_40[1] = fStack_6c;
      afStack_40[0] = fStack_70;
      lVar14 = 0;
      for (iVar16 = 0; bottom_top_blob = local_80, uVar11 = local_88, iVar16 + 3 < iVar13;
          iVar16 = iVar16 + 4) {
        local_58 = *(float (*) [2])*pauVar15;
        afStack_50 = *(float (*) [2])(*pauVar15 + 8);
        afVar28 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                            ((binary_op_pow *)&local_a1,(__m128 *)local_58,(__m128 *)local_48);
        auVar7._8_4_ = extraout_XMM0_Dc_01;
        auVar7._0_8_ = afVar28._0_8_;
        auVar7._12_4_ = extraout_XMM0_Dd_01;
        *pauVar15 = auVar7;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = local_90 * local_98 * local_88;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        fVar17 = powf(*(float *)((long)pvVar2 + lVar14 * 4 + lVar10),(float)local_68._0_4_);
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) = fVar17;
      }
      local_88 = uVar11 + 1;
    }
    break;
  case 7:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar21._0_4_ = fVar17 - *(float *)*pauVar15;
        auVar21._4_4_ = fVar17 - *(float *)((long)*pauVar15 + 4);
        auVar21._8_4_ = fVar17 - *(float *)((long)*pauVar15 + 8);
        auVar21._12_4_ = fVar17 - *(float *)((long)*pauVar15 + 0xc);
        *pauVar15 = auVar21;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) =
             fVar17 - *(float *)((long)pvVar2 + lVar14 * 4 + lVar10);
      }
    }
    break;
  case 8:
    fVar17 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar12 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar11 = uVar12;
    }
    for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
      lVar14 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
        auVar23 = *pauVar15;
        in_XMM3 = rcpps(in_XMM3,auVar23);
        fVar24 = fVar17 * in_XMM3._0_4_;
        fVar25 = fVar17 * in_XMM3._4_4_;
        fVar26 = fVar17 * in_XMM3._8_4_;
        fVar27 = fVar17 * in_XMM3._12_4_;
        *(float *)*pauVar15 = (fVar17 - auVar23._0_4_ * fVar24) * in_XMM3._0_4_ + fVar24;
        *(float *)(*pauVar15 + 4) = (fVar17 - auVar23._4_4_ * fVar25) * in_XMM3._4_4_ + fVar25;
        *(float *)(*pauVar15 + 8) = (fVar17 - auVar23._8_4_ * fVar26) * in_XMM3._8_4_ + fVar26;
        *(float *)(*pauVar15 + 0xc) = (fVar17 - auVar23._12_4_ * fVar27) * in_XMM3._12_4_ + fVar27;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = sVar4 * sVar3 * uVar12;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) =
             fVar17 / *(float *)((long)pvVar2 + lVar14 * 4 + lVar10);
      }
    }
    break;
  case 9:
    local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_68 = ZEXT416((uint)local_78);
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    while (local_88 != local_a0) {
      pvVar2 = bottom_top_blob->data;
      local_98 = bottom_top_blob->elemsize;
      local_90 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(local_90 * local_88 * local_98 + (long)pvVar2);
      local_48[1] = fStack_74;
      local_48[0] = local_78;
      afStack_40[1] = fStack_6c;
      afStack_40[0] = fStack_70;
      lVar14 = 0;
      for (iVar16 = 0; bottom_top_blob = local_80, uVar11 = local_88, iVar16 + 3 < iVar13;
          iVar16 = iVar16 + 4) {
        local_58 = *(float (*) [2])*pauVar15;
        afStack_50 = *(float (*) [2])(*pauVar15 + 8);
        afVar28 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                            ((binary_op_rpow *)&local_a1,(__m128 *)local_58,(__m128 *)local_48);
        auVar6._8_4_ = extraout_XMM0_Dc_00;
        auVar6._0_8_ = afVar28._0_8_;
        auVar6._12_4_ = extraout_XMM0_Dd_00;
        *pauVar15 = auVar6;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = local_90 * local_98 * local_88;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        fVar17 = powf((float)local_68._0_4_,*(float *)((long)pvVar2 + lVar14 * 4 + lVar10));
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) = fVar17;
      }
      local_88 = uVar11 + 1;
    }
    break;
  case 10:
    local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_68 = ZEXT416((uint)local_78);
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    while (local_88 != local_a0) {
      pvVar2 = bottom_top_blob->data;
      local_98 = bottom_top_blob->elemsize;
      local_90 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(local_90 * local_88 * local_98 + (long)pvVar2);
      local_48[1] = fStack_74;
      local_48[0] = local_78;
      afStack_40[1] = fStack_6c;
      afStack_40[0] = fStack_70;
      lVar14 = 0;
      for (iVar16 = 0; bottom_top_blob = local_80, uVar11 = local_88, iVar16 + 3 < iVar13;
          iVar16 = iVar16 + 4) {
        local_58 = *(float (*) [2])*pauVar15;
        afStack_50 = *(float (*) [2])(*pauVar15 + 8);
        afVar28 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                            ((binary_op_atan2 *)&local_a1,(__m128 *)local_58,(__m128 *)local_48);
        auVar5._8_4_ = extraout_XMM0_Dc_02;
        auVar5._0_8_ = afVar28._0_8_;
        auVar5._12_4_ = extraout_XMM0_Dd_02;
        *pauVar15 = auVar5;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = local_90 * local_98 * local_88;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        fVar17 = atan2f(*(float *)((long)pvVar2 + lVar14 * 4 + lVar10),(float)local_68._0_4_);
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) = fVar17;
      }
      local_88 = uVar11 + 1;
    }
    break;
  case 0xb:
    local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_68 = ZEXT416((uint)local_78);
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    while (local_88 != local_a0) {
      pvVar2 = bottom_top_blob->data;
      local_98 = bottom_top_blob->elemsize;
      local_90 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(local_90 * local_88 * local_98 + (long)pvVar2);
      local_48[1] = fStack_74;
      local_48[0] = local_78;
      afStack_40[1] = fStack_6c;
      afStack_40[0] = fStack_70;
      lVar14 = 0;
      for (iVar16 = 0; bottom_top_blob = local_80, uVar11 = local_88, iVar16 + 3 < iVar13;
          iVar16 = iVar16 + 4) {
        local_58 = *(float (*) [2])*pauVar15;
        afStack_50 = *(float (*) [2])(*pauVar15 + 8);
        afVar28 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4
                            (&local_a1,(__m128 *)local_58,(__m128 *)local_48);
        auVar23._8_4_ = extraout_XMM0_Dc;
        auVar23._0_8_ = afVar28._0_8_;
        auVar23._12_4_ = extraout_XMM0_Dd;
        *pauVar15 = auVar23;
        pauVar15 = pauVar15 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar10 = local_90 * local_98 * local_88;
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        fVar17 = atan2f((float)local_68._0_4_,*(float *)((long)pvVar2 + lVar14 * 4 + lVar10));
        *(float *)((long)pvVar2 + lVar14 * 4 + lVar10) = fVar17;
      }
      local_88 = uVar11 + 1;
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_functor;

    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    return 0;
}